

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

void xmlFreeMutex(xmlMutexPtr tok)

{
  xmlMutexPtr tok_local;
  
  if (tok != (xmlMutexPtr)0x0) {
    if (libxml_is_threaded != 0) {
      pthread_mutex_destroy((pthread_mutex_t *)tok);
    }
    free(tok);
  }
  return;
}

Assistant:

void
xmlFreeMutex(xmlMutexPtr tok)
{
    if (tok == NULL)
        return;

#ifdef HAVE_POSIX_THREADS
    if (libxml_is_threaded != 0)
        pthread_mutex_destroy(&tok->lock);
#elif defined HAVE_WIN32_THREADS
    DeleteCriticalSection(&tok->cs);
#endif
    free(tok);
}